

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O3

int merged(int lA,int lB)

{
  long lVar1;
  int iVar2;
  int iVar3;
  instrStruct *piVar4;
  
  if (lA != 0) {
    iVar2 = 0;
    if (0 < lA) {
      iVar2 = lA;
    }
    iVar2 = iVar2 + 1;
    piVar4 = firstInstr;
    do {
      piVar4 = piVar4->next;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
    iVar2 = piVar4->instr;
    lVar1 = (long)iVar2 % (long)bigNum;
    iVar3 = (int)lVar1;
    while (iVar3 != 0) {
      iVar2 = (int)lVar1;
      if (iVar2 < 1) {
        iVar2 = 0;
      }
      iVar2 = iVar2 + 1;
      piVar4 = firstInstr;
      do {
        piVar4 = piVar4->next;
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
      iVar2 = piVar4->instr;
      lVar1 = (long)iVar2 % (long)bigNum;
      iVar3 = (int)lVar1;
    }
    piVar4->instr = iVar2 + lB;
    lB = lA;
  }
  return lB;
}

Assistant:

procedure 
int merged(int lA, int lB) {
	variable int lC; variable int lD;
	variable struct instrStruct *element;
	lC = 0; lD = 0;
	if (lA != 0) {
		lC = lA;
		element = getInstruction(lC);
		lD = element->instr % bigNum;
		while (lD != 0) {
			lC = lD;
			element = getInstruction(lC);
			lD = element->instr % bigNum;
		}
		element->instr = element->instr - lD + lB;
		return lA;
	}
	return lB;
}